

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_navigator.h
# Opt level: O2

CordRep * __thiscall
absl::lts_20240722::cord_internal::CordRepBtreeNavigator::
Init<(absl::lts_20240722::cord_internal::CordRepBtree::EdgeType)0>
          (CordRepBtreeNavigator *this,CordRepBtree *tree)

{
  byte bVar1;
  CordRep *pCVar2;
  byte bVar3;
  ulong uVar4;
  
  if (tree == (CordRepBtree *)0x0) {
    __assert_fail("tree != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.h"
                  ,0xae,
                  "CordRep *absl::cord_internal::CordRepBtreeNavigator::Init(CordRepBtree *) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront]"
                 );
  }
  if ((tree->super_CordRep).storage[2] != (tree->super_CordRep).storage[1]) {
    bVar1 = (tree->super_CordRep).storage[0];
    if (bVar1 < 0xc) {
      this->height_ = (uint)bVar1;
      bVar3 = (tree->super_CordRep).storage[1];
      this->node_[bVar1] = tree;
      uVar4 = (ulong)bVar1;
      while( true ) {
        this->index_[uVar4] = bVar3;
        if ((long)uVar4 < 1) break;
        pCVar2 = CordRepBtree::Edge(tree,(ulong)bVar3);
        tree = CordRep::btree(pCVar2);
        this->node_[uVar4 - 1] = tree;
        bVar3 = (tree->super_CordRep).storage[1];
        uVar4 = uVar4 - 1;
      }
      pCVar2 = CordRepBtree::Edge(this->node_[0],(ulong)bVar3);
      return pCVar2;
    }
    __assert_fail("tree->height() <= CordRepBtree::kMaxHeight",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.h"
                  ,0xb0,
                  "CordRep *absl::cord_internal::CordRepBtreeNavigator::Init(CordRepBtree *) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront]"
                 );
  }
  __assert_fail("tree->size() > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.h"
                ,0xaf,
                "CordRep *absl::cord_internal::CordRepBtreeNavigator::Init(CordRepBtree *) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront]"
               );
}

Assistant:

inline CordRep* CordRepBtreeNavigator::Init(CordRepBtree* tree) {
  assert(tree != nullptr);
  assert(tree->size() > 0);
  assert(tree->height() <= CordRepBtree::kMaxHeight);
  int height = height_ = tree->height();
  size_t index = tree->index(edge_type);
  node_[height] = tree;
  index_[height] = static_cast<uint8_t>(index);
  while (--height >= 0) {
    tree = tree->Edge(index)->btree();
    node_[height] = tree;
    index = tree->index(edge_type);
    index_[height] = static_cast<uint8_t>(index);
  }
  return node_[0]->Edge(index);
}